

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.cpp
# Opt level: O1

int __thiscall
TadsHttpServerThread::send_simple
          (TadsHttpServerThread *this,char *status_code,char *mime_type,char *msg_body,
          size_t msg_len,char *extra_headers)

{
  void *pvVar1;
  ssize_t sVar2;
  int iVar3;
  int __fd;
  int __flags;
  size_t sVar4;
  char hdr [100];
  char buf [200];
  char local_168 [112];
  char local_f8 [200];
  
  iVar3 = 0;
  sVar4 = msg_len;
  t3sprintf(local_168,100,"HTTP/1.1 %s\r\n");
  __flags = (int)sVar4;
  pvVar1 = (void *)strlen(local_168);
  sVar2 = TadsServerThread::send
                    (&this->super_TadsServerThread,(int)local_168,pvVar1,(size_t)status_code,__flags
                    );
  if ((int)sVar2 != 0) {
    if (extra_headers != (char *)0x0) {
      pvVar1 = (void *)strlen(extra_headers);
      TadsServerThread::send
                (&this->super_TadsServerThread,(int)extra_headers,pvVar1,(size_t)status_code,__flags
                );
    }
    if (msg_body == (char *)0x0) {
      __fd = 0x2cee49;
      msg_len = 2;
    }
    else {
      sVar4 = msg_len;
      t3sprintf(local_f8,200,
                "Content-Type: %s\r\nContent-Length: %lu\r\nCache-control: no-cache\r\nConnection: Keep-Alive\r\n\r\n"
               );
      __flags = (int)sVar4;
      pvVar1 = (void *)strlen(local_f8);
      sVar2 = TadsServerThread::send
                        (&this->super_TadsServerThread,(int)local_f8,pvVar1,(size_t)mime_type,
                         __flags);
      if ((int)sVar2 == 0) {
        return 0;
      }
      __fd = (int)msg_body;
      status_code = mime_type;
    }
    iVar3 = 0;
    sVar2 = TadsServerThread::send
                      (&this->super_TadsServerThread,__fd,(void *)msg_len,(size_t)status_code,
                       __flags);
    if ((int)sVar2 != 0) {
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int TadsHttpServerThread::send_simple(
    const char *status_code, const char *mime_type,
    const char *msg_body, size_t msg_len,
    const char *extra_headers)
{
    char hdr[100];

    /* send the response */
    t3sprintf(hdr, sizeof(hdr), "HTTP/1.1 %s\r\n", status_code);
    if (!send(hdr, strlen(hdr)))
        return FALSE;

    /* send the extra headers */
    if (extra_headers != 0)
        send(extra_headers, strlen(extra_headers));

    /* if there's a message body, send it, with a content-length header */
    if (msg_body != 0)
    {
        char buf[200];

        /* build the cache-control and content-length header */
        t3sprintf(buf, sizeof(buf),
                  "Content-Type: %s\r\n"
                  "Content-Length: %lu\r\n"
                  "Cache-control: no-cache\r\n"
                  "Connection: Keep-Alive\r\n"
                  "\r\n",
                  mime_type, (ulong)msg_len);

        /* send the headers, followed by the message body */
        if (!send(buf, strlen(buf))
            || !send(msg_body, msg_len))
            return FALSE;
    }
    else
    {
        /* 
         *   there's no body, so just send a blank line to mark the end of
         *   the header 
         */
        if (!send("\r\n", 2))
            return FALSE;
    }

    /* success */
    return TRUE;
}